

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# idl_gen_go.cpp
# Opt level: O3

bool __thiscall flatbuffers::go::GoGenerator::generate(GoGenerator *this)

{
  Parser *pPVar1;
  pointer ppEVar2;
  pointer ppEVar3;
  bool bVar4;
  Namespace *ns;
  string filename;
  string code;
  string one_file_code;
  string local_90;
  string local_70;
  string local_50;
  
  local_50._M_string_length = 0;
  local_50.field_2._M_local_buf[0] = '\0';
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  bVar4 = generateEnums(this,&local_50);
  if (bVar4) {
    bVar4 = generateStructs(this,&local_50);
    if (bVar4) {
      bVar4 = true;
      if ((((this->super_BaseGenerator).parser_)->opts).one_file == true) {
        local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_70,"");
        pPVar1 = (this->super_BaseGenerator).parser_;
        ppEVar2 = (pPVar1->enums_).vec.
                  super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        ppEVar3 = (pPVar1->enums_).vec.
                  super__Vector_base<flatbuffers::EnumDef_*,_std::allocator<flatbuffers::EnumDef_*>_>
                  ._M_impl.super__Vector_impl_data._M_finish;
        BaseGenerator::LastNamespacePart_abi_cxx11_
                  (&local_90,(BaseGenerator *)&this->go_namespace_,ns);
        BeginFile(this,&local_90,true,ppEVar2 != ppEVar3,&local_70);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_50._M_dataplus._M_p);
        BaseGenerator::GeneratedFileName
                  (&local_90,&this->super_BaseGenerator,(this->super_BaseGenerator).path_,
                   (this->super_BaseGenerator).file_name_,
                   &((this->super_BaseGenerator).parser_)->opts);
        bVar4 = SaveFile(local_90._M_dataplus._M_p,local_70._M_dataplus._M_p,
                         local_70._M_string_length,false);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_90._M_dataplus._M_p != &local_90.field_2) {
          operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_70._M_dataplus._M_p != &local_70.field_2) {
          operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
        }
      }
      goto LAB_001fc1b1;
    }
  }
  bVar4 = false;
LAB_001fc1b1:
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,
                    CONCAT71(local_50.field_2._M_allocated_capacity._1_7_,
                             local_50.field_2._M_local_buf[0]) + 1);
  }
  return bVar4;
}

Assistant:

bool generate() {
    std::string one_file_code;

    if (!generateEnums(&one_file_code)) return false;
    if (!generateStructs(&one_file_code)) return false;

    if (parser_.opts.one_file) {
      std::string code = "";
      const bool is_enum = !parser_.enums_.vec.empty();
      BeginFile(LastNamespacePart(go_namespace_), true, is_enum, &code);
      code += one_file_code;
      const std::string filename =
          GeneratedFileName(path_, file_name_, parser_.opts);
      return SaveFile(filename.c_str(), code, false);
    }

    return true;
  }